

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  ostream *poVar1;
  pointer pcVar2;
  ostringstream msg;
  string local_1b8;
  ostream local_198;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  GetExecutionFilePath_abi_cxx11_(&local_1b8,this);
  poVar1 = std::operator<<(&local_198,(string *)&local_1b8);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,"):  ");
  std::__cxx11::string::~string((string *)&local_1b8);
  poVar1 = std::operator<<(&local_198,(string *)lff);
  std::operator<<(poVar1,"(");
  for (pcVar2 = (lff->Arguments).
                super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar2 != (lff->Arguments).
                super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
                super__Vector_impl_data._M_finish; pcVar2 = pcVar2 + 1) {
    std::operator<<(&local_198,(string *)pcVar2);
    std::operator<<(&local_198," ");
  }
  std::operator<<(&local_198,")");
  std::__cxx11::stringbuf::str();
  cmSystemTools::Message(local_1b8._M_dataplus._M_p,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  std::ostringstream msg;
  msg << this->GetExecutionFilePath() << "(" << lff.Line << "):  ";
  msg << lff.Name << "(";
  for(std::vector<cmListFileArgument>::const_iterator i =
        lff.Arguments.begin(); i != lff.Arguments.end(); ++i)
    {
    msg << i->Value;
    msg << " ";
    }
  msg << ")";
  cmSystemTools::Message(msg.str().c_str());
}